

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,
               Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
               *src,assign_op<double,_double> *func,type param_4)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  Matrix<double,__1,_1,_0,__1,_1> *rhs;
  double *pdVar4;
  double dVar5;
  Index IVar6;
  Index size;
  double *pdVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ActualDstType actualDst;
  long lVar10;
  type tmp;
  Matrix<double,__1,_1,_0,__1,_1> local_38;
  Scalar local_20;
  
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  uVar3 = (((src->m_lhs).m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          ).m_storage.m_cols;
  pdVar7 = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar9 = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (uVar3 != 0) {
    if ((long)uVar3 < 0) goto LAB_0014ae22;
    free((void *)0x0);
    uVar9 = uVar3;
    if (uVar3 == 0) {
      pdVar7 = (double *)0x0;
    }
    else {
      if (uVar3 >> 0x3d != 0) {
LAB_0014acf9:
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::ios::widen;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pdVar7 = (double *)malloc(uVar3 * 8);
      if (uVar3 != 1 && ((ulong)pdVar7 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pdVar7 == (double *)0x0) goto LAB_0014acf9;
    }
  }
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar9;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar7;
  if (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
  {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  rhs = src->m_rhs;
  if (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0)
  {
    memset(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,
           0,local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows << 3);
  }
  local_20 = 1.0;
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
  ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>(&local_38,&src->m_lhs,rhs,&local_20);
  IVar6 = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar7 = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    if (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0
       ) {
LAB_0014ae22:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)dst,
               local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows,local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,1);
  }
  uVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar3 != IVar6) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                 );
  }
  pdVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar9 = uVar3 - ((long)uVar3 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar3) {
    lVar10 = 0;
    do {
      pdVar1 = pdVar7 + lVar10;
      dVar5 = pdVar1[1];
      pdVar2 = pdVar4 + lVar10;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar5;
      lVar10 = lVar10 + 2;
    } while (lVar10 < (long)uVar9);
  }
  if ((long)uVar9 < (long)uVar3) {
    do {
      pdVar4[uVar9] = pdVar7[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment(Dst& dst, const Src& src, const Func& func, typename enable_if< evaluator_assume_aliasing<Src>::value, void*>::type = 0)
{
  typename plain_matrix_type<Src>::type tmp(src);
  call_assignment_no_alias(dst, tmp, func);
}